

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O2

void free_adiak_type(adiak_datatype_t *t)

{
  long lVar1;
  
  if ((t != (adiak_datatype_t *)0x0) && ((t->dtype & ~adiak_int) == adiak_range)) {
    for (lVar1 = 0; lVar1 < t->num_subtypes; lVar1 = lVar1 + 1) {
      free_adiak_type(t->subtype[lVar1]);
    }
    if (t->num_subtypes != 0) {
      free(t->subtype);
    }
    free(t);
    return;
  }
  return;
}

Assistant:

static void free_adiak_type(adiak_datatype_t *t)
{
   int i;
   if (t == NULL)
      return;
   if (is_basetype(t->dtype))
      return;
   for (i = 0; i < t->num_subtypes; i++) {
      free_adiak_type(t->subtype[i]);
   }
   if (t->num_subtypes)
      free(t->subtype);
   free(t);
}